

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot_i.hpp
# Opt level: O3

bool __thiscall Gnuplot::file_available(Gnuplot *this,string *filename)

{
  int iVar1;
  ostream *poVar2;
  runtime_error *this_00;
  ostringstream local_1b8 [8];
  ostringstream except;
  ios_base local_148 [264];
  string local_40 [32];
  
  std::__cxx11::ostringstream::ostringstream(local_1b8);
  iVar1 = access((filename->_M_dataplus)._M_p,0);
  if (iVar1 == 0) {
    access((filename->_M_dataplus)._M_p,4);
    std::__cxx11::ostringstream::~ostringstream(local_1b8);
    std::ios_base::~ios_base(local_148);
    return false;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"File \"",6);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1b8,(filename->_M_dataplus)._M_p,filename->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" does not exist",0x10);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,local_40);
  *(undefined ***)this_00 = &PTR__runtime_error_00107d78;
  __cxa_throw(this_00,&GnuplotException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool Gnuplot::file_available(const std::string &filename) {
  std::ostringstream except;
  if (Gnuplot::file_exists(filename, 0)) {   // check existence
    if (!(Gnuplot::file_exists(filename, 4))) {   // check read permission
// except << "No read permission for File \"" << filename << "\"";
// throw GnuplotException(except.str());
// return false;
    }
  } else {
    except << "File \"" << filename << "\" does not exist";
    throw GnuplotException(except.str());
    return false;
  }
  return false;
}